

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_decompress(void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_customMem customMem;
  ZSTD_DCtx *pZVar1;
  ZSTD_DCtx *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  ZSTD_DCtx *in_RDI;
  ZSTD_DCtx *dctx;
  size_t regenSize;
  size_t in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  customMem.customFree = (ZSTD_freeFunction)in_RSI;
  customMem.customAlloc = (ZSTD_allocFunction)in_RDX;
  customMem.opaque = in_RDI;
  pZVar1 = ZSTD_createDCtx_internal(customMem);
  if (pZVar1 == (ZSTD_DCtx *)0x0) {
    local_8 = 0xffffffffffffffc0;
  }
  else {
    local_8 = ZSTD_decompressDCtx(in_RDI,in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd0);
    ZSTD_freeDCtx(in_RCX);
  }
  return local_8;
}

Assistant:

size_t ZSTD_decompress(void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
#if defined(ZSTD_HEAPMODE) && (ZSTD_HEAPMODE>=1)
    size_t regenSize;
    ZSTD_DCtx* const dctx =  ZSTD_createDCtx_internal(ZSTD_defaultCMem);
    RETURN_ERROR_IF(dctx==NULL, memory_allocation, "NULL pointer!");
    regenSize = ZSTD_decompressDCtx(dctx, dst, dstCapacity, src, srcSize);
    ZSTD_freeDCtx(dctx);
    return regenSize;
#else   /* stack mode */
    ZSTD_DCtx dctx;
    ZSTD_initDCtx_internal(&dctx);
    return ZSTD_decompressDCtx(&dctx, dst, dstCapacity, src, srcSize);
#endif
}